

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O2

Matrix<double> * __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
compute_opt_strategy_postL
          (Matrix<double> *__return_storage_ptr__,
          APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
          *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  long *plVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  element_type *peVar13;
  const_reference cVar14;
  vector<long_long,_std::allocator<long_long>_> *this_00;
  double *pdVar15;
  pointer plVar16;
  pointer pdVar17;
  long lVar18;
  pointer plVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  _Elt_pointer psVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  int w;
  long lVar27;
  int i;
  ulong uVar28;
  long lVar29;
  size_type col;
  ulong uVar30;
  double dVar31;
  int size2;
  int local_2f0;
  int local_2ec;
  double local_2e8;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_I;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_R;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_v;
  vector<long_long,_std::allocator<long_long>_> cost2_I;
  vector<long_long,_std::allocator<long_long>_> cost2_R;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_L;
  vector<double,_std::allocator<double>_> cost2_path;
  vector<long_long,_std::allocator<long_long>_> cost2_L;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_v;
  size_t local_170;
  __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_140;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> leafRow;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_L;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_I;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_R;
  
  uVar3 = (t1->super_Constants).tree_size_;
  sVar21 = (size_t)(int)uVar3;
  iVar4 = (t2->super_Constants).tree_size_;
  data_structures::Matrix<double>::Matrix(__return_storage_ptr__,sVar21,(long)iVar4);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&cost1_L,sVar21,(allocator_type *)&rowsToReuse_L);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&cost1_R,sVar21,(allocator_type *)&rowsToReuse_L);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&cost1_I,sVar21,(allocator_type *)&rowsToReuse_L);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&cost2_L,(long)iVar4,(allocator_type *)&rowsToReuse_L);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&cost2_R,(long)iVar4,(allocator_type *)&rowsToReuse_L);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&cost2_I,(long)iVar4,(allocator_type *)&rowsToReuse_L);
  std::vector<double,_std::allocator<double>_>::vector
            (&cost2_path,(long)iVar4,(allocator_type *)&rowsToReuse_L);
  this_00 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (this_00,(long)iVar4,(allocator_type *)&rowsToReuse_L);
  std::__shared_ptr<std::vector<long_long,std::allocator<long_long>>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::vector<long_long,std::allocator<long_long>>,void>
            ((__shared_ptr<std::vector<long_long,std::allocator<long_long>>,(__gnu_cxx::_Lock_policy)2>
              *)&leafRow,this_00);
  cost_Lpointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Lpointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cost_Rpointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Rpointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cost_Ipointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Ipointer_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cost_Lpointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Lpointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cost_Rpointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Rpointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cost_Ipointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cost_Ipointer_parent_v.
  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            (&rowsToReuse_L);
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            (&rowsToReuse_R);
  std::
  stack<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>>
  ::
  stack<std::deque<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::shared_ptr<std::vector<long_long,std::allocator<long_long>>>>>,void>
            (&rowsToReuse_I);
  dVar31 = (double)(int)uVar3;
  uVar30 = 0;
  uVar28 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar28 = uVar30;
  }
  local_2f0 = -1;
  local_2ec = local_2f0;
  do {
    if (uVar30 == uVar28) {
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~deque(&rowsToReuse_I.c);
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~deque(&rowsToReuse_R.c);
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~deque(&rowsToReuse_L.c);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Ipointer_parent_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Rpointer_parent_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Lpointer_parent_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Ipointer_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Rpointer_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&cost_Lpointer_v.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&leafRow.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&cost2_path.super__Vector_base<double,_std::allocator<double>_>);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                (&cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                (&cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>);
      std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                (&cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>);
      std::
      vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~vector(&cost1_I);
      std::
      vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~vector(&cost1_R);
      std::
      vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~vector(&cost1_L);
      return __return_storage_ptr__;
    }
    iVar5 = (t1->super_PostLToPreL).postl_to_prel_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar30];
    sVar21 = (size_t)iVar5;
    iVar6 = (t1->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar21];
    sVar20 = (size_t)iVar6;
    if (sVar20 != 0xffffffffffffffff) {
      local_2f0 = (t1->super_PreLToPostL).prel_to_postl_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[sVar20];
    }
    uVar3 = (t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar21];
    uVar24 = (ulong)uVar3;
    uVar7 = (t1->super_PreRToPreL).prer_to_prel_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start
            [(long)(int)uVar3 +
             (long)(t1->super_PreLToPreR).prel_to_prer_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[sVar21] + -1];
    lVar10 = (t1->super_PreLToSpfCost).prel_to_cost_left_.
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[sVar21];
    lVar11 = (t1->super_PreLToSpfCost).prel_to_cost_right_.
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[sVar21];
    lVar12 = (t1->super_PreLToSpfCost).prel_to_cost_all_.
             super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[sVar21];
    if (uVar24 == 1) {
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost1_L.
                 super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar30].
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&leafRow.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost1_R.
                 super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar30].
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&leafRow.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost1_I.
                 super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar30].
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&leafRow.
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      for (lVar29 = 0; lVar29 < iVar4; lVar29 = lVar29 + 1) {
        pdVar15 = data_structures::Matrix<double>::at
                            (__return_storage_ptr__,sVar21,
                             (long)(t2->super_PostLToPreL).postl_to_prel_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar29]);
        *pdVar15 = (double)iVar5;
      }
    }
    std::
    __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&cost_Lpointer_v.
               super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&cost1_L.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
             );
    std::
    __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&cost_Rpointer_v.
               super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&cost1_R.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
             );
    std::
    __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
    operator=(&cost_Ipointer_v.
               super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&cost1_I.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
             );
    lVar29 = (long)local_2f0;
    if (iVar6 != -1) {
      if (cost1_L.
          super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar29].
          super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr == (element_type *)0x0) {
        if (rowsToReuse_L.c.
            super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            rowsToReuse_L.c.
            super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_140);
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_L.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_140);
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_R.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
          std::make_shared<std::vector<long_long,std::allocator<long_long>>,int_const&>
                    ((int *)&local_140);
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_I.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&local_140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140._M_refcount);
        }
        else {
          psVar23 = rowsToReuse_L.c.
                    super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (rowsToReuse_L.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              rowsToReuse_L.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar23 = rowsToReuse_L.c.
                      super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_L.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&psVar23[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     );
          psVar23 = rowsToReuse_R.c.
                    super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (rowsToReuse_R.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              rowsToReuse_R.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar23 = rowsToReuse_R.c.
                      super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_R.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&psVar23[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     );
          psVar23 = rowsToReuse_I.c.
                    super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (rowsToReuse_I.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              rowsToReuse_I.c.
              super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar23 = rowsToReuse_I.c.
                      super__Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          std::
          __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
          ::operator=(&cost1_I.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ,&psVar23[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     );
          std::
          deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ::pop_back(&rowsToReuse_L.c);
          std::
          deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ::pop_back(&rowsToReuse_R.c);
          std::
          deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ::pop_back(&rowsToReuse_I.c);
        }
      }
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost_Lpointer_parent_v.
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&cost1_L.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar29].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost_Rpointer_parent_v.
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&cost1_R.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar29].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      std::
      __shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>::
      operator=(&cost_Ipointer_parent_v.
                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ,&cost1_I.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar29].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
               );
      local_170 = sVar20;
    }
    for (plVar19 = cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
        plVar16 = cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
        plVar19 !=
        cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish; plVar19 = plVar19 + 1) {
      *plVar19 = 0;
    }
    for (; plVar19 = cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
        plVar16 !=
        cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish; plVar16 = plVar16 + 1) {
      *plVar16 = 0;
    }
    for (; pdVar17 = cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
        plVar19 !=
        cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish; plVar19 = plVar19 + 1) {
      *plVar19 = 0;
    }
    for (; pdVar17 !=
           cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish; pdVar17 = pdVar17 + 1) {
      *pdVar17 = 0.0;
    }
    for (lVar27 = 0; lVar27 < iVar4; lVar27 = lVar27 + 1) {
      iVar8 = (t2->super_PostLToPreL).postl_to_prel_.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar27];
      col = (size_type)iVar8;
      iVar9 = (t2->super_PreLToParent).prel_to_parent_.super__Vector_base<int,_std::allocator<int>_>
              ._M_impl.super__Vector_impl_data._M_start[col];
      if ((long)iVar9 != -1) {
        local_2ec = (t2->super_PreLToPostL).prel_to_postl_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[iVar9];
      }
      uVar25 = (t2->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start[col];
      uVar26 = (ulong)uVar25;
      if (uVar26 == 1) {
        cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = 0;
        cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = 0;
        cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = 0;
        cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = (double)iVar8;
LAB_00106575:
        if ((int)uVar25 < (int)uVar3) {
          uVar25 = uVar3;
        }
        local_2e8 = -1.0;
        lVar22 = (long)(int)uVar25;
      }
      else {
        if (((int)uVar3 < 2) || ((int)uVar25 < 2)) goto LAB_00106575;
        lVar22 = (t2->super_PreLToSpfCost).prel_to_cost_left_.
                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[col] * uVar24 +
                 ((cost_Lpointer_v.
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        local_2e8 = -1.0;
        if (lVar22 != 0x7fffffffffffffff) {
          local_2e8 = (double)(int)~uVar7;
        }
        lVar18 = (t2->super_PreLToSpfCost).prel_to_cost_right_.
                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[col] * uVar24 +
                 ((cost_Rpointer_v.
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        if (lVar18 < lVar22) {
          lVar22 = lVar18;
          local_2e8 = (double)(int)(iVar5 + uVar3);
        }
        lVar18 = (t2->super_PreLToSpfCost).prel_to_cost_all_.
                 super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[col] * uVar24 +
                 ((cost_Ipointer_v.
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        if (lVar18 < lVar22) {
          pdVar15 = data_structures::Matrix<double>::at(__return_storage_ptr__,sVar21,col);
          local_2e8 = *pdVar15 + 1.0;
          lVar22 = lVar18;
        }
        lVar18 = lVar10 * uVar26 +
                 cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        if (lVar18 < lVar22) {
          local_2e8 = -((double)(t2->super_PreRToPreL).prer_to_prel_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(long)(int)uVar25 +
                                 (long)(t2->super_PreLToPreR).prel_to_prer_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[col] + -1] + dVar31 + 1.0);
          lVar22 = lVar18;
        }
        lVar18 = lVar11 * uVar26 +
                 cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        if (lVar18 < lVar22) {
          local_2e8 = (double)(int)(iVar8 + uVar25 + -1) + dVar31 + 1.0;
          lVar22 = lVar18;
        }
        lVar18 = uVar26 * lVar12 +
                 cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27];
        if (lVar18 < lVar22) {
          local_2e8 = cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27] + dVar31 + 1.0;
          lVar22 = lVar18;
        }
      }
      if (iVar6 != -1) {
        plVar1 = ((cost_Rpointer_parent_v.
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar27;
        *plVar1 = *plVar1 + lVar22;
        lVar18 = ((cost1_I.
                   super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar30].
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar27] - lVar22;
        if (lVar18 < ((cost1_I.
                       super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar29].
                       super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar27]) {
          ((cost_Ipointer_parent_v.
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar27] = lVar18;
          pdVar15 = data_structures::Matrix<double>::read_at(__return_storage_ptr__,sVar21,col);
          dVar2 = *pdVar15;
          pdVar15 = data_structures::Matrix<double>::at(__return_storage_ptr__,local_170,col);
          *pdVar15 = dVar2;
        }
        cVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(t1->super_PreLToTypeRight).prel_to_type_right_,sVar21);
        if (cVar14) {
          plVar19 = ((cost_Rpointer_parent_v.
                      super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          plVar1 = ((cost_Ipointer_parent_v.
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar27;
          *plVar1 = *plVar1 + plVar19[lVar27];
          plVar1 = plVar19 + lVar27;
          *plVar1 = *plVar1 + (((cost_Rpointer_v.
                                 super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)
                               ._M_impl.super__Vector_impl_data._M_start[lVar27] - lVar22);
        }
        cVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(t1->super_PreLToTypeLeft).prel_to_type_left_,sVar21);
        lVar18 = lVar22;
        if (cVar14) {
          lVar18 = ((cost_Lpointer_v.
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        plVar1 = ((cost_Lpointer_parent_v.
                   super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                 super__Vector_impl_data._M_start + lVar27;
        *plVar1 = *plVar1 + lVar18;
      }
      if (iVar9 != -1) {
        lVar18 = (long)local_2ec;
        cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] =
             cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] + lVar22;
        if (cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] - lVar22 <
            cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18]) {
          cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] =
               cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27] - lVar22;
          cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] =
               cost2_path.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27];
        }
        cVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(t2->super_PreLToTypeRight).prel_to_type_right_,col);
        if (cVar14) {
          cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] =
               cost2_I.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar18] +
               cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar18];
          cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] =
               cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar18] +
               (cost2_R.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27] - lVar22);
        }
        cVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&(t2->super_PreLToTypeLeft).prel_to_type_left_,col);
        if (cVar14) {
          lVar22 = cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar27];
        }
        cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar18] =
             cost2_L.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] + lVar22;
      }
      pdVar15 = data_structures::Matrix<double>::at(__return_storage_ptr__,sVar21,col);
      *pdVar15 = local_2e8;
    }
    if ((t1->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[sVar21] != 1) {
      peVar13 = cost1_L.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      plVar16 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (plVar19 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; plVar19 != plVar16; plVar19 = plVar19 + 1) {
        *plVar19 = 0;
      }
      peVar13 = cost1_R.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      plVar16 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (plVar19 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; plVar19 != plVar16; plVar19 = plVar19 + 1) {
        *plVar19 = 0;
      }
      peVar13 = cost1_I.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar30].
                super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      plVar16 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      for (plVar19 = (peVar13->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start; plVar19 != plVar16; plVar19 = plVar19 + 1) {
        *plVar19 = 0;
      }
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::push_back(&rowsToReuse_L.c,
                  cost1_L.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar30);
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::push_back(&rowsToReuse_R.c,
                  cost1_R.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar30);
      std::
      deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::push_back(&rowsToReuse_I.c,
                  cost1_I.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar30);
    }
    uVar30 = uVar30 + 1;
  } while( true );
}

Assistant:

data_structures::Matrix<double> APTEDTreeIndex<CostModel, TreeIndex>::compute_opt_strategy_postL(const TreeIndex& t1, const TreeIndex& t2) {
  const int size1 = t1.tree_size_;
  const int size2 = t2.tree_size_;
  data_structures::Matrix<double> strategy(size1, size2);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_L(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_R(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_I(size1);
  std::vector<long long int> cost2_L(size2);
  std::vector<long long int> cost2_R(size2);
  std::vector<long long int> cost2_I(size2);
  std::vector<double> cost2_path(size2);
  std::shared_ptr<std::vector<long long int>> leafRow(new std::vector<long long int>(size2));
  double pathIDOffset = static_cast<double>(size1);
  long long int minCost = std::numeric_limits<long long int>::max();
  double strategyPath = -1.0;

  const std::vector<int>& pre2size1 = t1.prel_to_size_;
  const std::vector<int>& pre2size2 = t2.prel_to_size_;
  const std::vector<long long int>& pre2descSum1 = t1.prel_to_cost_all_;
  const std::vector<long long int>& pre2descSum2 = t2.prel_to_cost_all_;
  const std::vector<long long int>& pre2krSum1 = t1.prel_to_cost_left_;
  const std::vector<long long int>& pre2krSum2 = t2.prel_to_cost_left_;
  const std::vector<long long int>& pre2revkrSum1 = t1.prel_to_cost_right_;
  const std::vector<long long int>& pre2revkrSum2 = t2.prel_to_cost_right_;
  const std::vector<int>& preL_to_preR_1 = t1.prel_to_prer_;
  const std::vector<int>& preL_to_preR_2 = t2.prel_to_prer_;
  const std::vector<int>& preR_to_preL_1 = t1.prer_to_prel_;
  const std::vector<int>& preR_to_preL_2 = t2.prer_to_prel_;
  const std::vector<int>& pre2parent1 = t1.prel_to_parent_;
  const std::vector<int>& pre2parent2 = t2.prel_to_parent_;
  const std::vector<bool>& nodeType_L_1 = t1.prel_to_type_left_;
  const std::vector<bool>& nodeType_L_2 = t2.prel_to_type_left_;
  const std::vector<bool>& nodeType_R_1 = t1.prel_to_type_right_;
  const std::vector<bool>& nodeType_R_2 = t2.prel_to_type_right_;

  const std::vector<int>& preL_to_postL_1 = t1.prel_to_postl_;
  const std::vector<int>& preL_to_postL_2 = t2.prel_to_postl_;

  const std::vector<int>& postL_to_preL_1 = t1.postl_to_prel_;
  const std::vector<int>& postL_to_preL_2 = t2.postl_to_prel_;

  int size_v = -1;
  int parent_v_preL = -1;
  int parent_w_preL = -1;
  int parent_w_postL = -1;
  int size_w = -1;
  int parent_v_postL = -1;
  double leftPath_v;
  double rightPath_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_v;
  // std::vector<double>* strategypointer_v;
  std::size_t strategypointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_parent_v;
  // std::vector<double>* strategypointer_parent_v;
  std::size_t strategypointer_parent_v;
  long long int krSum_v;
  long long int revkrSum_v;
  long long int descSum_v;
  bool is_v_leaf;

  int v_in_preL;
  int w_in_preL;

  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_L;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_R;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_I;

  for(int v = 0; v < size1; ++v) {
    v_in_preL = postL_to_preL_1[v];

    is_v_leaf = t1.prel_to_size_[v_in_preL] == 1;
    parent_v_preL = pre2parent1[v_in_preL];

    if (parent_v_preL != -1) {
      parent_v_postL = preL_to_postL_1[parent_v_preL];
    }

    // strategypointer_v = strategy[v_in_preL];
    strategypointer_v = v_in_preL;

    size_v = pre2size1[v_in_preL];
    leftPath_v = static_cast<double>(-(preR_to_preL_1[preL_to_preR_1[v_in_preL] + size_v - 1] + 1));// this is the left path's ID which is the leftmost leaf node: l-r_preorder(r-l_preorder(v) + |Fv| - 1)
    rightPath_v = static_cast<double>(v_in_preL + size_v - 1 + 1); // this is the right path's ID which is the rightmost leaf node: l-r_preorder(v) + |Fv| - 1

    krSum_v = pre2krSum1[v_in_preL];
    revkrSum_v = pre2revkrSum1[v_in_preL];
    descSum_v = pre2descSum1[v_in_preL];

    if(is_v_leaf) {
      cost1_L[v] = leafRow;
      cost1_R[v] = leafRow;
      cost1_I[v] = leafRow;
      for(int i = 0; i < size2; ++i) {
        // strategypointer_v[postL_to_preL_2[i]] = v_in_preL;
        strategy.at(strategypointer_v, postL_to_preL_2[i]) = static_cast<double>(v_in_preL);
      }
    }

    cost_Lpointer_v = cost1_L[v];
    cost_Rpointer_v = cost1_R[v];
    cost_Ipointer_v = cost1_I[v];

    if(parent_v_preL != -1 && cost1_L[parent_v_postL] == nullptr) {
      if (rowsToReuse_L.empty()) {
        cost1_L[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_R[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_I[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
      } else {
        cost1_L[parent_v_postL] = rowsToReuse_L.top();
        cost1_R[parent_v_postL] = rowsToReuse_R.top();
        cost1_I[parent_v_postL] = rowsToReuse_I.top();
        rowsToReuse_L.pop();
        rowsToReuse_R.pop();
        rowsToReuse_I.pop();
      }
    }

    if (parent_v_preL != -1) {
      cost_Lpointer_parent_v = cost1_L[parent_v_postL];
      cost_Rpointer_parent_v = cost1_R[parent_v_postL];
      cost_Ipointer_parent_v = cost1_I[parent_v_postL];
      // strategypointer_parent_v = strategy[parent_v_preL];
      strategypointer_parent_v = parent_v_preL;
    }

    // Arrays.fill(cost2_L, 0L);
    std::fill(cost2_L.begin(),cost2_L.end(), 0);
    // Arrays.fill(cost2_R, 0L);
    std::fill(cost2_R.begin(),cost2_R.end(), 0);
    // Arrays.fill(cost2_I, 0L);
    std::fill(cost2_I.begin(),cost2_I.end(), 0);
    // Arrays.fill(cost2_path, 0);
    std::fill(cost2_path.begin(),cost2_path.end(), 0);

    for(int w = 0; w < size2; ++w) {
      w_in_preL = postL_to_preL_2[w];

      parent_w_preL = pre2parent2[w_in_preL];
      if (parent_w_preL != -1) {
        parent_w_postL = preL_to_postL_2[parent_w_preL];
      }

      size_w = pre2size2[w_in_preL];
      if (t2.prel_to_size_[w_in_preL] == 1) {
        cost2_L[w] = 0;
        cost2_R[w] = 0;
        cost2_I[w] = 0;
        cost2_path[w] = w_in_preL;
      }
      minCost = std::numeric_limits<long long int>::max();
      strategyPath = -1.0;
      long long int tmpCost = std::numeric_limits<long long int>::max();

      if (size_v <= 1 || size_w <= 1) { // USE NEW SINGLE_PATH FUNCTIONS FOR SMALL SUBTREES
        minCost = std::max(size_v, size_w);
      } else {
        tmpCost = size_v * pre2krSum2[w_in_preL] + (*cost_Lpointer_v)[w];
        // std::cout << "tmpCost [1] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = leftPath_v;
          // std::cout << "strategyPath [1] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2revkrSum2[w_in_preL] + (*cost_Rpointer_v)[w];
        // std::cout << "tmpCost [2] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = rightPath_v;
          // std::cout << "strategyPath [2] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2descSum2[w_in_preL] + (*cost_Ipointer_v)[w];
        // std::cout << "tmpCost [3] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          // strategyPath = (int)strategypointer_v[w_in_preL] + 1;
          strategyPath = strategy.at(strategypointer_v, w_in_preL) + 1.0;
          // std::cout << "strategyPath [3] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * krSum_v + cost2_L[w];
        // std::cout << "tmpCost [4] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(-(preR_to_preL_2[preL_to_preR_2[w_in_preL] + size_w - 1] + pathIDOffset + 1.0));
          // std::cout << "strategyPath [4] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * revkrSum_v + cost2_R[w];
        // std::cout << "tmpCost [5] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(w_in_preL + size_w - 1) + pathIDOffset + 1.0;
          // std::cout << "strategyPath [5] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * descSum_v + cost2_I[w];
        // std::cout << "tmpCost [6] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = cost2_path[w] + pathIDOffset + 1.0;
          // std::cout << "strategyPath [6] = " << strategyPath << std::endl;
        }
      }

      // std::cout << "minCost = " << minCost << std::endl;

      if (parent_v_preL != -1) {
        (*cost_Rpointer_parent_v)[w] += minCost;
        tmpCost = -minCost + (*cost1_I[v])[w];
        if (tmpCost < (*cost1_I[parent_v_postL])[w]) {
          (*cost_Ipointer_parent_v)[w] = tmpCost;
          // strategypointer_parent_v[w_in_preL] = strategypointer_v[w_in_preL];
          strategy.at(strategypointer_parent_v, w_in_preL) = strategy.read_at(strategypointer_v, w_in_preL);
        }
        if (nodeType_R_1[v_in_preL]) {
          (*cost_Ipointer_parent_v)[w] += (*cost_Rpointer_parent_v)[w];
          (*cost_Rpointer_parent_v)[w] += (*cost_Rpointer_v)[w] - minCost;
        }
        if (nodeType_L_1[v_in_preL]) {
          (*cost_Lpointer_parent_v)[w] += (*cost_Lpointer_v)[w];
        } else {
          (*cost_Lpointer_parent_v)[w] += minCost;
        }
      }
      if (parent_w_preL != -1) {
        cost2_R[parent_w_postL] += minCost;
        tmpCost = -minCost + cost2_I[w];
        if (tmpCost < cost2_I[parent_w_postL]) {
          cost2_I[parent_w_postL] = tmpCost;
          cost2_path[parent_w_postL] = cost2_path[w];
        }
        if (nodeType_R_2[w_in_preL]) {
          cost2_I[parent_w_postL] += cost2_R[parent_w_postL];
          cost2_R[parent_w_postL] += cost2_R[w] - minCost;
        }
        if (nodeType_L_2[w_in_preL]) {
          cost2_L[parent_w_postL] += cost2_L[w];
        } else {
          cost2_L[parent_w_postL] += minCost;
        }
      }
      // strategypointer_v[w_in_preL] = strategyPath;
      strategy.at(strategypointer_v, w_in_preL) = strategyPath;
      // std::cout << "strategy[" << strategypointer_v << "," << w_in_preL << "] = " << strategy.read_at(0, 0) << std::endl;
    }

    if (!(t1.prel_to_size_[v_in_preL] == 1)) {
      // Arrays.fill(cost1_L[v], 0);
      std::fill(cost1_L[v]->begin(), cost1_L[v]->end(), 0.0);
      // Arrays.fill(cost1_R[v], 0);
      std::fill(cost1_R[v]->begin(), cost1_R[v]->end(), 0.0);
      // Arrays.fill(cost1_I[v], 0);
      std::fill(cost1_I[v]->begin(), cost1_I[v]->end(), 0.0);
      rowsToReuse_L.push(cost1_L[v]);
      rowsToReuse_R.push(cost1_R[v]);
      rowsToReuse_I.push(cost1_I[v]);
      // NOTE: The pointers under cost1_L[v] do not have to be nulled.
    }

  }
  
  // std::cout << "strategy[0][0] = " << strategy.read_at(0, 0) << std::endl;
  return strategy;
}